

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsQuerySetTarget(HelicsQuery query,char *target,HelicsError *err)

{
  QueryObject *this;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this = anon_unknown.dwarf_1862f::getQueryObj(query,err);
  if (this != (QueryObject *)0x0) {
    if (target == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_30,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,target,&local_31);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->target,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void helicsQuerySetTarget(HelicsQuery query, const char* target, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->target = AS_STRING(target);
}